

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_reader.c
# Opt level: O3

dtl_dv_t * dtl_json_load(FILE *fh)

{
  int iVar1;
  dtl_dv_t *pdVar2;
  dtl_json_reader_t reader;
  ifstream_t ifstream;
  dtl_json_reader_t dStack_b8;
  undefined1 local_50 [32];
  undefined1 *local_30;
  undefined8 local_28;
  code *local_20;
  code *local_18;
  
  dtl_json_reader_create(&dStack_b8);
  local_28 = 0;
  local_18 = dtl_json_reader_readChunk;
  local_20 = dtl_json_reader_close;
  local_30 = (undefined1 *)&dStack_b8;
  ifstream_create(local_50);
  iVar1 = ifstream_readTextFileFromHandle(local_50,fh);
  if (((iVar1 == 0) && (dStack_b8.parseComplete == true)) &&
     (pdVar2 = (dStack_b8.data)->currentElem, pdVar2 != (dtl_dv_t *)0x0)) {
    dtl_dv_inc_ref(pdVar2);
  }
  else {
    pdVar2 = (dtl_dv_t *)0x0;
  }
  dtl_json_reader_destroy(&dStack_b8);
  return pdVar2;
}

Assistant:

dtl_dv_t* dtl_json_load(FILE *fh)
{
   dtl_dv_t *retval = (dtl_dv_t*) 0;
   ifstream_handler_t handler;
   ifstream_t ifstream;
   dtl_json_reader_t reader;
   dtl_json_reader_create(&reader);
   memset(&handler, 0, sizeof(handler));
   handler.arg = (void*) &reader;
   handler.write = dtl_json_reader_readChunk;
   handler.close = dtl_json_reader_close;
   ifstream_create(&ifstream, &handler);
   if (ifstream_readTextFileFromHandle(&ifstream, fh) == 0)
   {
      if ( (reader.parseComplete) && (reader.data->currentElem != 0) )
      {
         retval = reader.data->currentElem;
         dtl_dv_inc_ref(reader.data->currentElem);
      }
      dtl_json_reader_destroy(&reader);
   }
   else
   {
      dtl_json_reader_destroy(&reader);
   }
   return retval;
}